

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_applyScaledBounds<double>
          (SoPlexBase<double> *this,SPxSolverBase<double> *solver,Rational *primalScale)

{
  int iVar1;
  SPxOut *pSVar2;
  type_conflict5 tVar3;
  bool bVar4;
  Verbosity VVar5;
  RangeType *pRVar6;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_RDX;
  SPxOut *in_RSI;
  SoPlexBase<double> *in_RDI;
  int c;
  Verbosity old_verbosity;
  undefined4 in_stack_fffffffffffffeb8;
  fmtflags in_stack_fffffffffffffebc;
  SPxOut *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffee0;
  double local_b8;
  Real local_b0;
  undefined4 local_a4;
  double local_a0;
  double local_98;
  undefined4 local_8c;
  Real local_88;
  undefined4 local_7c;
  int local_78;
  string local_68 [36];
  Verbosity local_44;
  Verbosity local_40 [4];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_30;
  SPxOut *local_28;
  Verbosity *local_18;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_10;
  Verbosity *local_8;
  
  local_40[3] = 1;
  local_30 = in_RDX;
  local_28 = in_RSI;
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (int *)in_stack_fffffffffffffec0);
  if (tVar3) {
    local_40[2] = 1;
    local_10 = local_30;
    local_18 = local_40 + 2;
    local_8 = local_18;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)in_stack_fffffffffffffec0,
                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  local_40[1] = 1;
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (int *)in_stack_fffffffffffffec0);
  if (((tVar3) && (in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8)) &&
     (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar5)) {
    local_40[0] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_44 = INFO2;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_44);
    soplex::operator<<(in_stack_fffffffffffffec0,
                       (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
    ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (streamsize)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    soplex::operator<<(in_stack_fffffffffffffec0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    soplex::operator<<(in_stack_fffffffffffffec0,
                       (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::__cxx11::string::~string(local_68);
    SPxOut::setVerbosity(&in_RDI->spxout,local_40);
  }
  local_78 = numColsRational((SoPlexBase<double> *)0x46d173);
  while (local_78 = local_78 + -1, -1 < local_78) {
    pRVar6 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_78);
    bVar4 = _lowerFinite(in_RDI,pRVar6);
    if (bVar4) {
      local_7c = 1;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (int *)in_stack_fffffffffffffec0);
      if (tVar3) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::operator*=(in_stack_fffffffffffffee0,
                     (self_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x46d24c);
      pSVar2 = local_28;
      iVar1 = local_78;
      if (tVar3) {
        local_88 = realParam(in_RDI,INFTY);
        local_88 = -local_88;
        (**(code **)((((rational_type *)&pSVar2->_vptr_SPxOut)->num).m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x150))(pSVar2,iVar1,&local_88,0);
      }
      else {
        local_8c = 1;
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           (int *)in_stack_fffffffffffffec0);
        pSVar2 = local_28;
        iVar1 = local_78;
        if (tVar3) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          local_98 = boost::multiprecision::number::operator_cast_to_double
                               ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)0x46d31e);
          (**(code **)((((rational_type *)&pSVar2->_vptr_SPxOut)->num).m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] + 0x150))(pSVar2,iVar1,&local_98,0);
        }
        else {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          local_a0 = boost::multiprecision::number::operator_cast_to_double
                               ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)0x46d380);
          (**(code **)((((rational_type *)&pSVar2->_vptr_SPxOut)->num).m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] + 0x150))(pSVar2,iVar1,&local_a0);
        }
      }
    }
    pRVar6 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_78);
    bVar4 = _upperFinite(in_RDI,pRVar6);
    if (bVar4) {
      local_a4 = 1;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (int *)in_stack_fffffffffffffec0);
      if (tVar3) {
        in_stack_fffffffffffffee0 = local_30;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::operator*=(in_stack_fffffffffffffee0,
                     (self_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      tVar3 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x46d467);
      pSVar2 = local_28;
      if (tVar3) {
        in_stack_fffffffffffffedc = local_78;
        local_b0 = realParam(in_RDI,INFTY);
        (**(code **)((((rational_type *)&pSVar2->_vptr_SPxOut)->num).m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x168))(pSVar2,in_stack_fffffffffffffedc,&local_b0);
      }
      else {
        in_stack_fffffffffffffec0 = local_28;
        in_stack_fffffffffffffecc = local_78;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)local_28,in_stack_fffffffffffffebc);
        local_b8 = boost::multiprecision::number::operator_cast_to_double
                             ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x46d4f9);
        (**(code **)((((rational_type *)&in_stack_fffffffffffffec0->_vptr_SPxOut)->num).m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x168))
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffecc,&local_b8);
      }
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledBounds(SPxSolverBase<T>& solver, Rational& primalScale)
{
   if(primalScale < 1)
      primalScale = 1;

   if(primalScale > 1)
      SPX_MSG_INFO2(spxout, spxout << "Scaling primal by " << primalScale.str() << ".\n");

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_lowerFinite(_colTypes[c]))
      {
         if(primalScale > 1)
            _modLower[c] *= primalScale;

         if(_modLower[c] <= _rationalNegInfty)
            solver.changeLower(c, -realParam(SoPlexBase<R>::INFTY));
         else if(primalScale > 1)
            solver.changeLower(c, T(_modLower[c]));
         else
            solver.changeLower(c, T(_modLower[c]));
      }

      if(_upperFinite(_colTypes[c]))
      {
         if(primalScale > 1)
            _modUpper[c] *= primalScale;

         if(_modUpper[c] >= _rationalPosInfty)
            solver.changeUpper(c, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeUpper(c, T(_modUpper[c]));
      }
   }
}